

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall
CVmObject::find_modifier_prop
          (CVmObject *this,vm_prop_id_t prop,vm_val_t *retval,vm_obj_id_t self,
          vm_obj_id_t orig_target_obj,vm_obj_id_t defining_obj,vm_obj_id_t *source_obj,uint *argc)

{
  bool bVar1;
  vm_obj_id_t vVar2;
  int iVar3;
  CVmMetaclass *this_00;
  CVmObject *pCVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint in_ECX;
  undefined8 in_RDX;
  ushort in_SI;
  undefined8 *in_RDI;
  uint in_R9D;
  bool bVar5;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  vm_obj_id_t mod_obj;
  int found_def_obj;
  vm_meta_entry_t *entry;
  undefined8 in_stack_ffffffffffffffa0;
  CVmMetaTable *in_stack_ffffffffffffffa8;
  CVmMetaTable *this_01;
  vm_meta_entry_t *local_38;
  uint local_2c;
  
  bVar1 = false;
  this_00 = (CVmMetaclass *)(**(code **)*in_RDI)(in_RDI,in_stack_00000008);
  CVmMetaclass::get_reg_idx(this_00);
  local_38 = CVmMetaTable::get_entry_from_reg
                       (in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  local_2c = in_R9D;
  do {
    bVar5 = false;
    if (local_38 != (vm_meta_entry_t *)0x0) {
      bVar5 = local_38->class_obj_ != 0;
    }
    if (!bVar5) {
      return 0;
    }
    vm_objp(0);
    vVar2 = CVmObjClass::get_mod_obj((CVmObjClass *)0x3209e8);
    if (((vVar2 == 0) || (local_2c == 0)) || (bVar1)) {
LAB_00320a34:
      if (vVar2 != 0) {
        pCVar4 = vm_objp(0);
        in_stack_ffffffffffffffa0 = in_stack_00000010;
        iVar3 = (*pCVar4->_vptr_CVmObject[0xf])
                          (pCVar4,(ulong)in_SI,in_RDX,(ulong)in_ECX,(ulong)vVar2,(ulong)local_2c,
                           in_stack_00000008);
        if (iVar3 != 0) {
          return 1;
        }
      }
    }
    else {
      if (vVar2 == local_2c) {
LAB_00320a26:
        bVar1 = true;
        goto LAB_00320a34;
      }
      pCVar4 = vm_objp(0);
      iVar3 = (*pCVar4->_vptr_CVmObject[7])(pCVar4,(ulong)local_2c);
      if (iVar3 != 0) goto LAB_00320a26;
    }
    iVar3 = (*local_38->meta_->_vptr_CVmMetaclass[0xb])();
    if (CONCAT44(extraout_var,iVar3) == 0) {
      return 0;
    }
    this_01 = G_meta_table_X;
    iVar3 = (*local_38->meta_->_vptr_CVmMetaclass[0xb])();
    CVmMetaclass::get_reg_idx((CVmMetaclass *)CONCAT44(extraout_var_00,iVar3));
    local_38 = CVmMetaTable::get_entry_from_reg
                         (this_01,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    if (bVar1) {
      local_2c = 0;
    }
  } while( true );
}

Assistant:

int CVmObject::find_modifier_prop(VMG_ vm_prop_id_t prop, vm_val_t *retval,
                                  vm_obj_id_t self,
                                  vm_obj_id_t orig_target_obj,
                                  vm_obj_id_t defining_obj,
                                  vm_obj_id_t *source_obj,
                                  uint *argc)
{
    vm_meta_entry_t *entry;
    int found_def_obj;

    /* we haven't yet found the defining superclass */
    found_def_obj = FALSE;

    /* get my metaclass from the dependency table */
    entry = (G_meta_table
             ->get_entry_from_reg(get_metaclass_reg()->get_reg_idx()));

    /* 
     *   if there's an associated intrinsic class object, check to see if
     *   it provides a user modifier object for this intrinsic class 
     */
    while (entry != 0 && entry->class_obj_ != VM_INVALID_OBJ)
    {
        vm_obj_id_t mod_obj;
        
        /* ask the intrinsic class object for the user modifier object */
        mod_obj = ((CVmObjClass *)vm_objp(vmg_ entry->class_obj_))
                  ->get_mod_obj();

        /* 
         *   If we have a defining object, we must ignore objects in the
         *   superclass tree until we find the defining object.  Therefore,
         *   scan up the superclass tree for mod_obj and see if we can find
         *   the defining object; when we find it, we can start looking at
         *   objects for real at the defining object's superclass.
         *   
         *   (Superclasses in modifier objects aren't real superclasses,
         *   because modifier objects are classless.  Instead, the superclass
         *   list simply implements the 'modify' chain.)  
         */
        if (mod_obj != VM_INVALID_OBJ
            && defining_obj != VM_INVALID_OBJ && !found_def_obj)
        {
            /* 
             *   if the defining object isn't among the byte-code
             *   superclasses of the modifier object, we must skip this
             *   entire intrinsic class and move to the intrinsic superclass 
             */
            if (mod_obj == defining_obj
                || vm_objp(vmg_ mod_obj)->is_instance_of(vmg_ defining_obj))
            {
                /* 
                 *   the defining object is among my modifier family - this
                 *   means that this is the intrinsic superclass where we
                 *   found the modifier method 
                 */
                found_def_obj = TRUE;
            }
            else
            {
                /*
                 *   The current defining object is not part of the modifier
                 *   chain for this intrinsic class, so we've already skipped
                 *   past this point in the intrinsic superclass tree on past
                 *   inheritances.  Simply move to the next intrinsic class
                 *   and look at its modifier.  
                 */
                goto next_intrinsic_sc;
            }
        }

        /* 
         *   If there's a modifier object, send the property request to it.
         *   We are effectively delegating the method call to the modifier
         *   object, so we must use the "inherited property" call, not the
         *   plain get_prop() call: 'self' is the original self, but the
         *   target object is the intrinsic class modifier object.  
         */
        if (mod_obj != VM_INVALID_OBJ
            && vm_objp(vmg_ mod_obj)->inh_prop(
                vmg_ prop, retval, self, mod_obj, defining_obj,
                source_obj, argc))
            return TRUE;

        /* we didn't find it in this object, so look at its super-metaclass */
    next_intrinsic_sc:
        if (entry->meta_->get_supermeta_reg() != 0)
        {
            /* get the super-metaclass ID */
            entry = (G_meta_table
                     ->get_entry_from_reg(entry->meta_
                                          ->get_supermeta_reg()
                                          ->get_reg_idx()));

            /* 
             *   if we've already found the previous defining intrinsic
             *   class, we can forget about the previous defining modifier
             *   object now: since we're moving to a new intrinsic
             *   superclass, we will have no superclass relation to the
             *   previous defining object in the new modifier family, so we
             *   can simply use the next definition of the property we find 
             */
            if (found_def_obj)
                defining_obj = VM_INVALID_OBJ;
        }
        else
        {
            /* no super-metaclass - give up */
            break;
        }
    }

    /* we don't have a modifier object, so the property is undefined */
    return FALSE;
}